

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Diagonal<Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::internal::assign_op<double,double>>
               (Matrix<double,__1,_1,_0,__1,_1> *dst,
               Diagonal<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> *src,
               assign_op<double,_double> *func)

{
  undefined1 local_70 [8];
  SrcEvaluatorType srcEvaluator;
  Kernel kernel;
  DstEvaluatorType dstEvaluator;
  
  srcEvaluator._0_8_ =
       (src->m_matrix->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
       m_data;
  srcEvaluator.m_argImpl.
  super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_data =
       (Scalar *)
       (src->m_matrix->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
       m_rows;
  resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Diagonal<Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,double,double>
            (dst,src,func);
  kernel.m_dstExpr =
       (DstXprType *)
       (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  srcEvaluator._24_8_ = &kernel.m_dstExpr;
  kernel.m_dst = (DstEvaluatorType *)local_70;
  kernel.m_src = (SrcEvaluatorType *)func;
  kernel.m_functor = (assign_op<double,_double> *)dst;
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_Eigen::internal::evaluator<Eigen::Diagonal<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>_>,_Eigen::internal::assign_op<double,_double>,_0>,_1,_0>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::evaluator<Eigen::Diagonal<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>,_Eigen::internal::assign_op<double,_double>,_0>
         *)&srcEvaluator.field_0x18);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);
    
  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}